

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFGroupNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  XML *this_00;
  XMLLoader *pXVar1;
  int iVar2;
  GroupNode *this_01;
  mapped_type *node;
  runtime_error *this_02;
  long *in_RDX;
  size_t i;
  size_t i_00;
  size_t N;
  long lVar3;
  allocator local_81;
  long *local_80;
  XMLLoader *local_78;
  string local_70;
  size_t id;
  
  this_00 = (XML *)*in_RDX;
  local_80 = in_RDX;
  std::__cxx11::string::string((string *)&local_70,"numChildren",&local_81);
  XML::parm((string *)&id,this_00,&local_70);
  iVar2 = atoi((char *)id);
  N = (size_t)iVar2;
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&local_70);
  if ((*(long *)(*local_80 + 0xa0) - *(long *)(*local_80 + 0x98)) / 0x48 == N) {
    local_78 = this;
    this_01 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,N);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    lVar3 = 0;
    for (i_00 = 0; pXVar1 = local_78, N != i_00; i_00 = i_00 + 1) {
      iVar2 = Token::Int((Token *)(*(long *)(*local_80 + 0x98) + lVar3));
      id = (size_t)iVar2;
      node = std::
             map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::at((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                   *)(xml + 0xc),&id);
      SceneGraph::GroupNode::set(this_01,i_00,node);
      lVar3 = lVar3 + 0x48;
    }
    (local_78->path).filename._M_dataplus._M_p = (pointer)this_01;
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_01);
    (**(code **)((long)(this_01->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_01);
    return (Ref<embree::SceneGraph::Node>)(Node *)pXVar1;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_70,(ParseLocation *)(*local_80 + 0x10));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,&local_70,
                 ": invalid group node");
  std::runtime_error::runtime_error(this_02,(string *)&id);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFGroupNode(const Ref<XML>& xml) 
  {
    const size_t N  = atoi(xml->parm("numChildren").c_str());
    if (xml->body.size() != N) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid group node");

    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode(N);
    for (size_t i=0; i<N; i++) 
    {
      const size_t id = xml->body[i].Int();
      group->set(i,id2node.at(id));
    }
    return group.cast<SceneGraph::Node>();
  }